

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  int *piVar1;
  ImVector<float> *pIVar2;
  ImGuiWindow *pIVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ImGuiContext *ctx;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  
  pIVar6 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  fVar13 = (GImGui->Style).ItemInnerSpacing.x;
  auVar5 = vcvtdq2ps_avx(ZEXT416((uint)(int)((w_full - fVar13 * (float)(components + -1)) /
                                            (float)components)));
  auVar15 = SUB6416(ZEXT464(0x3f800000),0);
  auVar5 = vmaxss_avx(auVar15,auVar5);
  auVar14 = ZEXT1664(auVar5);
  fVar12 = auVar5._0_4_;
  auVar5 = vcvtdq2ps_avx(ZEXT416((uint)(int)(w_full - (fVar13 + fVar12) * (float)(components + -1)))
                        );
  iVar10 = (pIVar3->DC).ItemWidthStack.Size;
  iVar11 = (pIVar3->DC).ItemWidthStack.Capacity;
  if (iVar10 == iVar11) {
    iVar10 = iVar10 + 1;
    if (iVar11 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar11 / 2 + iVar11;
    }
    if (iVar10 < iVar8) {
      iVar10 = iVar8;
    }
    if (iVar11 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar10 << 2,GImAllocatorUserData);
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if (pfVar4 != (float *)0x0) {
        memcpy(pfVar7,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
        pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
        if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
      }
      (pIVar3->DC).ItemWidthStack.Data = pfVar7;
      (pIVar3->DC).ItemWidthStack.Capacity = iVar10;
      auVar14 = ZEXT464((uint)fVar12);
      auVar15 = SUB6416(ZEXT464(0x3f800000),0);
    }
  }
  auVar5 = vmaxss_avx(auVar15,auVar5);
  (pIVar3->DC).ItemWidthStack.Data[(pIVar3->DC).ItemWidthStack.Size] = (pIVar3->DC).ItemWidth;
  iVar11 = (pIVar3->DC).ItemWidthStack.Size;
  iVar8 = (pIVar3->DC).ItemWidthStack.Capacity;
  iVar10 = iVar11 + 1;
  (pIVar3->DC).ItemWidthStack.Size = iVar10;
  if (iVar10 == iVar8) {
    iVar11 = iVar11 + 2;
    if (iVar8 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar8 / 2 + iVar8;
    }
    if (iVar11 < iVar10) {
      iVar11 = iVar10;
    }
    if (iVar8 < iVar11) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar11 << 2,GImAllocatorUserData);
      pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
      if (pfVar4 != (float *)0x0) {
        memcpy(pfVar7,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
        pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
        if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
      }
      (pIVar3->DC).ItemWidthStack.Data = pfVar7;
      (pIVar3->DC).ItemWidthStack.Capacity = iVar11;
      auVar14 = ZEXT464((uint)fVar12);
    }
  }
  fVar13 = auVar14._0_4_;
  (pIVar3->DC).ItemWidthStack.Data[(pIVar3->DC).ItemWidthStack.Size] = auVar5._0_4_;
  pIVar2 = &(pIVar3->DC).ItemWidthStack;
  pIVar2->Size = pIVar2->Size + 1;
  if (2 < components) {
    iVar10 = components + -2;
    do {
      iVar11 = (pIVar3->DC).ItemWidthStack.Size;
      iVar8 = (pIVar3->DC).ItemWidthStack.Capacity;
      if (iVar11 == iVar8) {
        if (iVar8 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar8 / 2 + iVar8;
        }
        iVar11 = iVar11 + 1;
        if (iVar11 < iVar9) {
          iVar11 = iVar9;
        }
        if (iVar8 < iVar11) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          pfVar7 = (float *)(*GImAllocatorAllocFunc)((long)iVar11 << 2,GImAllocatorUserData);
          pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
          if (pfVar4 != (float *)0x0) {
            memcpy(pfVar7,pfVar4,(long)(pIVar3->DC).ItemWidthStack.Size << 2);
            pfVar4 = (pIVar3->DC).ItemWidthStack.Data;
            if ((pfVar4 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pfVar4,GImAllocatorUserData);
          }
          (pIVar3->DC).ItemWidthStack.Data = pfVar7;
          (pIVar3->DC).ItemWidthStack.Capacity = iVar11;
          auVar14 = ZEXT464((uint)fVar12);
        }
      }
      fVar13 = auVar14._0_4_;
      (pIVar3->DC).ItemWidthStack.Data[(pIVar3->DC).ItemWidthStack.Size] = fVar13;
      pIVar2 = &(pIVar3->DC).ItemWidthStack;
      pIVar2->Size = pIVar2->Size + 1;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  fVar12 = auVar5._0_4_;
  if (components != 1) {
    fVar12 = fVar13;
  }
  (pIVar3->DC).ItemWidth = fVar12;
  *(byte *)&(pIVar6->NextItemData).Flags = (byte)(pIVar6->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 2; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = (components == 1) ? w_item_last : w_item_one;
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}